

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * __thiscall Matrix4f::transposed(Matrix4f *this)

{
  undefined1 auVar1 [32];
  float *pfVar2;
  int i;
  long lVar3;
  Matrix4f *out;
  float *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  
  pfVar2 = in_RDI;
  *(undefined1 (*) [64])in_RDI = ZEXT1664(ZEXT816(0) << 0x40);
  lVar3 = 0;
  auVar1 = vpmovsxbq_avx2(ZEXT416(0xc080400));
  do {
    auVar5 = vpbroadcastq_avx512vl();
    vpaddq_avx2(auVar5,auVar1);
    auVar4 = vgatherqps_avx512vl(*(undefined8 *)(this->m_elements + lVar3));
    *(undefined1 (*) [16])in_RDI = auVar4;
    lVar3 = lVar3 + 1;
    in_RDI = in_RDI + 4;
  } while (lVar3 != 4);
  return (Matrix4f *)pfVar2;
}

Assistant:

Matrix4f Matrix4f::transposed() const
{
	Matrix4f out;
	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}